

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_file_block_manager.cpp
# Opt level: O2

block_id_t __thiscall duckdb::SingleFileBlockManager::GetFreeBlockId(SingleFileBlockManager *this)

{
  const_iterator __position;
  long lVar1;
  long local_20;
  
  ::std::mutex::lock(&this->block_lock);
  if ((this->free_list)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    lVar1 = this->max_block;
    this->max_block = lVar1 + 1;
  }
  else {
    __position._M_node = (this->free_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_20 = *(long *)(__position._M_node + 1);
    ::std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
    erase_abi_cxx11_((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>
                      *)&this->free_list,__position);
    ::std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::erase
              (&(this->newly_freed_list)._M_t,&local_20);
    lVar1 = local_20;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->block_lock);
  return lVar1;
}

Assistant:

block_id_t SingleFileBlockManager::GetFreeBlockId() {
	lock_guard<mutex> lock(block_lock);
	block_id_t block;
	if (!free_list.empty()) {
		// The free list is not empty, so we take its first element.
		block = *free_list.begin();
		// erase the entry from the free list again
		free_list.erase(free_list.begin());
		newly_freed_list.erase(block);
	} else {
		block = max_block++;
	}
	return block;
}